

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

void libssh2_publickey_list_free(LIBSSH2_PUBLICKEY *pkey,libssh2_publickey_list *pkey_list)

{
  LIBSSH2_SESSION *pLVar1;
  uchar **ppuVar2;
  libssh2_publickey_list *p;
  libssh2_publickey_list *plVar3;
  
  if (pkey_list != (libssh2_publickey_list *)0x0 && pkey != (LIBSSH2_PUBLICKEY *)0x0) {
    pLVar1 = pkey->channel->session;
    if (pkey_list->packet != (uchar *)0x0) {
      plVar3 = pkey_list + 1;
      do {
        if (plVar3[-1].attrs != (libssh2_publickey_attribute *)0x0) {
          (*pLVar1->free)(plVar3[-1].attrs,&pLVar1->abstract);
        }
        (*pLVar1->free)(plVar3[-1].packet,&pLVar1->abstract);
        ppuVar2 = &plVar3->packet;
        plVar3 = plVar3 + 1;
      } while (*ppuVar2 != (uchar *)0x0);
    }
    (*pLVar1->free)(pkey_list,&pLVar1->abstract);
    return;
  }
  return;
}

Assistant:

LIBSSH2_API void
libssh2_publickey_list_free(LIBSSH2_PUBLICKEY * pkey,
                            libssh2_publickey_list * pkey_list)
{
    LIBSSH2_SESSION *session;
    libssh2_publickey_list *p = pkey_list;

    if(!pkey || !p)
        return;

    session = pkey->channel->session;

    while(p->packet) {
        if(p->attrs) {
            LIBSSH2_FREE(session, p->attrs);
        }
        LIBSSH2_FREE(session, p->packet);
        p++;
    }

    LIBSSH2_FREE(session, pkey_list);
}